

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.h
# Opt level: O0

void __thiscall HuffmanEncoder::HuffmanEncoder(HuffmanEncoder *this,string *message)

{
  string local_38;
  string *local_18;
  string *message_local;
  HuffmanEncoder *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)message);
  Cryptor::Cryptor(&this->super_Cryptor,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_Cryptor)._vptr_Cryptor = (_func_int **)&PTR__HuffmanEncoder_00121b20;
  std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
  list(&this->nodes_);
  std::__cxx11::string::string((string *)&this->temp_code_);
  std::
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->table_);
  Cryptor::set_show(&this->super_Cryptor,true);
  return;
}

Assistant:

explicit HuffmanEncoder(const std::string& message) : Cryptor(message) { set_show(true); }